

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::
loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::RefIterator>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>> *this,
          RefIterator it)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_50;
  
  pMVar1 = it._pointer;
  while (pMVar1 != (it._stack)->_stack) {
    pMVar1 = pMVar1 + -1;
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_50,pMVar1);
    Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
              ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this,
               &local_50);
    Kernel::RationalConstantType::~RationalConstantType(&local_50.numeral);
  }
  return;
}

Assistant:

void loadFromIterator(It it) {
    // TODO check iterator.size() or iterator.sizeHint()
    while(it.hasNext()) {
      push(it.next());
    }
  }